

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  LibraryHandle pvVar1;
  bool bVar2;
  cmDynamicLoaderCache *pcVar3;
  allocator local_41;
  string local_40;
  char *local_20;
  LibraryHandle lh;
  char *libname_local;
  
  lh = libname;
  pcVar3 = cmDynamicLoaderCache::GetInstance();
  bVar2 = cmDynamicLoaderCache::GetCacheFile(pcVar3,(char *)lh,&local_20);
  pvVar1 = lh;
  if (bVar2) {
    libname_local = local_20;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,(char *)pvVar1,&local_41);
    local_20 = (char *)cmsys::DynamicLoader::OpenLibrary(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pcVar3 = cmDynamicLoaderCache::GetInstance();
    cmDynamicLoaderCache::CacheFile(pcVar3,(char *)lh,local_20);
    libname_local = local_20;
  }
  return libname_local;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname)
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if (cmDynamicLoaderCache::GetInstance()->GetCacheFile(libname, lh)) {
    return lh;
  }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance()->CacheFile(libname, lh);
  return lh;
}